

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# porting.c
# Opt level: O3

int uni_mutex_new(uni_mutex_t *mutex)

{
  pthread_mutex_t *__mutex;
  int iVar1;
  
  if (mutex == (uni_mutex_t *)0x0) {
    iVar1 = -2;
  }
  else {
    __mutex = (pthread_mutex_t *)malloc(0x28);
    mutex->hdl = __mutex;
    if (__mutex == (pthread_mutex_t *)0x0) {
      iVar1 = -1;
    }
    else {
      iVar1 = 0;
      pthread_mutex_init(__mutex,(pthread_mutexattr_t *)0x0);
    }
  }
  return iVar1;
}

Assistant:

int uni_mutex_new(uni_mutex_t *mutex) {
    if (NULL_PTR_CHECK(mutex)) {
        return -INVALID_IN_PARAM;
    }

    mutex->hdl = malloc(sizeof(pthread_mutex_t));
    if (NULL_PTR_CHECK(mutex->hdl)) {
        return -OUT_OF_MEMORY;
    }

    pthread_mutex_init((pthread_mutex_t *)mutex->hdl, NULL);
    return OK;
}